

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O2

void __thiscall antlr::CharScanner::match(CharScanner *this,char *s)

{
  byte bVar1;
  uint c;
  MismatchedCharException *this_00;
  
  while( true ) {
    if (*s == 0) {
      return;
    }
    c = (*(this->super_TokenStream)._vptr_TokenStream[3])(this,1);
    bVar1 = *s;
    if (c != bVar1) break;
    s = (char *)((byte *)s + 1);
    (*(this->super_TokenStream)._vptr_TokenStream[8])(this);
  }
  this_00 = (MismatchedCharException *)__cxa_allocate_exception(0x90);
  MismatchedCharException::MismatchedCharException(this_00,c,(uint)bVar1,false,this);
  __cxa_throw(this_00,&MismatchedCharException::typeinfo,
              MismatchedCharException::~MismatchedCharException);
}

Assistant:

virtual void match( const char* s )
	{
		while( *s != '\0' )
		{
			// the & 0xFF is here to prevent sign extension lateron
			int la_1 = LA(1), c = (*s++ & 0xFF);

			if ( la_1 != c )
				throw MismatchedCharException(la_1, c, false, this);

			consume();
		}
	}